

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall
Json::OurReader::decodeUnicodeEscapeSequence
          (OurReader *this,Token *token,Location *current,Location end,uint *unicode)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  string local_48;
  
  if ((long)end - (long)*current < 4) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Bad unicode escape sequence in string: four digits expected.",""
              );
    addError(this,&local_48,token,*current);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    bVar6 = false;
  }
  else {
    *unicode = 0;
    bVar6 = false;
    uVar4 = 0;
    uVar3 = 0;
    pcVar2 = *current;
    do {
      *current = pcVar2 + 1;
      cVar1 = *pcVar2;
      iVar5 = (int)cVar1;
      uVar3 = uVar3 * 0x10;
      *unicode = uVar3;
      if ((byte)(cVar1 - 0x30U) < 10) {
        uVar3 = (uVar3 + iVar5) - 0x30;
      }
      else if ((byte)(cVar1 + 0x9fU) < 6) {
        uVar3 = (uVar3 + iVar5) - 0x57;
      }
      else {
        if (5 < (byte)(cVar1 + 0xbfU)) {
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,
                     "Bad unicode escape sequence in string: hexadecimal digit expected.","");
          addError(this,&local_48,token,*current);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p == &local_48.field_2) {
            return bVar6;
          }
          operator_delete(local_48._M_dataplus._M_p);
          return bVar6;
        }
        uVar3 = (uVar3 + iVar5) - 0x37;
      }
      *unicode = uVar3;
      bVar6 = 2 < uVar4;
      uVar4 = uVar4 + 1;
      pcVar2 = pcVar2 + 1;
    } while (uVar4 != 4);
  }
  return bVar6;
}

Assistant:

bool OurReader::decodeUnicodeEscapeSequence(Token& token,
                                         Location& current,
                                         Location end,
                                         unsigned int& unicode) {
  if (end - current < 4)
    return addError(
        "Bad unicode escape sequence in string: four digits expected.",
        token,
        current);
  unicode = 0;
  for (int index = 0; index < 4; ++index) {
    Char c = *current++;
    unicode *= 16;
    if (c >= '0' && c <= '9')
      unicode += c - '0';
    else if (c >= 'a' && c <= 'f')
      unicode += c - 'a' + 10;
    else if (c >= 'A' && c <= 'F')
      unicode += c - 'A' + 10;
    else
      return addError(
          "Bad unicode escape sequence in string: hexadecimal digit expected.",
          token,
          current);
  }
  return true;
}